

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

bool __thiscall cmRST::ProcessInclude(cmRST *this,string *file,IncludeType type)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bd0;
  undefined1 local_ba0 [8];
  cmRST r;
  bool found;
  IncludeType type_local;
  string *file_local;
  cmRST *this_local;
  
  r.ReplaceName.field_2._M_local_buf[0xb] = '\0';
  if (this->IncludeDepth < 10) {
    r.ReplaceName.field_2._12_4_ = type;
    cmRST((cmRST *)local_ba0,this->OS,&this->DocRoot);
    r.DocRoot.field_2._8_4_ = this->IncludeDepth + 1;
    r.DocRoot.field_2._M_local_buf[0xc] = this->OutputLinePending & 1;
    if (r.ReplaceName.field_2._12_4_ != 2) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&r.DocDir.field_2 + 8),&this->Replace);
    }
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)file);
    if (*pcVar1 == '/') {
      std::operator+(&local_bd0,&this->DocRoot,file);
      std::__cxx11::string::operator=((string *)file,(string *)&local_bd0);
      std::__cxx11::string::~string((string *)&local_bd0);
    }
    else {
      std::operator+(&local_c10,&this->DocDir,"/");
      std::operator+(&local_bf0,&local_c10,file);
      std::__cxx11::string::operator=((string *)file,(string *)&local_bf0);
      std::__cxx11::string::~string((string *)&local_bf0);
      std::__cxx11::string::~string((string *)&local_c10);
    }
    r.ReplaceName.field_2._M_local_buf[0xb] =
         ProcessFile((cmRST *)local_ba0,file,r.ReplaceName.field_2._12_4_ == 1);
    if (r.ReplaceName.field_2._12_4_ != 2) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator=(&this->Replace,
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&r.DocDir.field_2 + 8));
    }
    this->OutputLinePending = (bool)(r.DocRoot.field_2._M_local_buf[0xc] & 1);
    ~cmRST((cmRST *)local_ba0);
  }
  return (bool)(r.ReplaceName.field_2._M_local_buf[0xb] & 1);
}

Assistant:

bool cmRST::ProcessInclude(std::string file, IncludeType type)
{
  bool found = false;
  if (this->IncludeDepth < 10) {
    cmRST r(this->OS, this->DocRoot);
    r.IncludeDepth = this->IncludeDepth + 1;
    r.OutputLinePending = this->OutputLinePending;
    if (type != IncludeTocTree) {
      r.Replace = this->Replace;
    }
    if (file[0] == '/') {
      file = this->DocRoot + file;
    } else {
      file = this->DocDir + "/" + file;
    }
    found = r.ProcessFile(file, type == IncludeModule);
    if (type != IncludeTocTree) {
      this->Replace = r.Replace;
    }
    this->OutputLinePending = r.OutputLinePending;
  }
  return found;
}